

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_stream.cpp
# Opt level: O2

int __thiscall mpt::io::stream::set_property(stream *this,char *pr,convertable *src)

{
  metatype *pmVar1;
  int iVar2;
  uint8_t l;
  
  if (pr == (char *)0x0) {
    if (this->_srm != (stream *)0x0) {
      iVar2 = mpt_stream_setter(this->_srm,src);
      if (iVar2 < 0) {
        return iVar2;
      }
      pmVar1 = (this->_ctx)._ref;
      if (pmVar1 != (metatype *)0x0) {
        (*(pmVar1->super_convertable)._vptr_convertable[1])();
      }
      (this->_ctx)._ref = (metatype *)0x0;
      return iVar2;
    }
  }
  else {
    iVar2 = strcasecmp(pr,"idlen");
    if (iVar2 == 0) {
      return -1;
    }
    if (this->_inputFile < 0) {
      if (src == (convertable *)0x0) {
        l = '\0';
      }
      else {
        iVar2 = (**src->_vptr_convertable)(src,0x79,&l);
        if (iVar2 < 0) {
          return iVar2;
        }
        if (0x80 < l) {
          return -2;
        }
      }
      this->_idlen = l;
      return 0;
    }
  }
  return -4;
}

Assistant:

int io::stream::set_property(const char *pr, convertable *src)
{
	if (!pr) {
		if (!_srm) {
			return BadOperation;
		}
		int ret = mpt_stream_setter(_srm, src);
		if (ret >= 0) {
			_ctx.set_instance(0);
		}
		return ret;
	}
	if (strcasecmp(pr, "idlen")) {
		if (_inputFile >= 0) {
			return BadOperation;
		}
		uint8_t l;
		
		if (!src) {
			l = 0;
		} else {
			int ret = src->convert(type_properties<uint8_t>::id(true), &l);
			if (ret < 0) {
				return ret;
			}
			if (l > std::numeric_limits<__decltype(_idlen)>::max() / 2 + 1) {
				return BadValue;
			}
		}
		_idlen = l;
		return 0;
	}
	return BadArgument;
}